

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall embree::FileStream::FileStream(FileStream *this,FileName *fileName)

{
  ifstream *this_00;
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Stream<int>::Stream(&this->super_Stream<int>);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__FileStream_002a1ee8;
  this_00 = &this->ifs;
  std::ifstream::ifstream(this_00);
  this->lineNumber = 1;
  this->colNumber = 0;
  this->charNumber = 0;
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)::operator_new(0x20);
  std::__cxx11::string::string((string *)__p,(string *)fileName);
  std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::__cxx11::string,void>
            ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)&this->name,__p);
  if (((&this->field_0x60)[*(long *)(*(long *)this_00 + -0x18)] & 5) == 0) {
    std::ifstream::close();
  }
  std::__cxx11::string::string((string *)&bStack_68,(string *)fileName);
  std::ifstream::open((string *)this_00,(_Ios_Openmode)&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_48,(string *)fileName);
  std::operator+(&bStack_68,"cannot open file ",&local_48);
  std::runtime_error::runtime_error(this_01,(string *)&bStack_68);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileStream (const FileName& fileName)
      : lineNumber(1), colNumber(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(fileName.str())))
    {
      if (ifs) ifs.close();
      ifs.open(fileName.str());
      if (!ifs.is_open()) THROW_RUNTIME_ERROR("cannot open file " + fileName.str());
    }